

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O1

bool mocker::detail::runOptPassImpl<mocker::LocalValueNumbering>
               (Module *module,BasicBlockPass *param_2)

{
  bool bVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  LocalValueNumbering local_90;
  
  p_Var3 = (module->funcs)._M_h._M_before_begin._M_nxt;
  bVar2 = false;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      if (*(char *)&p_Var3[0x11]._M_nxt == '\0') {
        for (p_Var4 = p_Var3[0xc]._M_nxt; p_Var4 != p_Var3 + 0xc; p_Var4 = p_Var4->_M_nxt) {
          LocalValueNumbering::LocalValueNumbering(&local_90,(BasicBlock *)(p_Var4 + 2));
          bVar1 = LocalValueNumbering::operator()(&local_90);
          bVar2 = (bool)(bVar2 | bVar1);
          local_90.super_BasicBlockPass.super_OptPass._vptr_OptPass =
               (_func_int **)&PTR__LocalValueNumbering_001f2430;
          std::
          vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ::~vector(&local_90.valueNumber2Addr);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_90.key2ValueNumber._M_h);
        }
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return bVar2;
}

Assistant:

bool runOptPassImpl(ir::Module &module, BasicBlockPass *, Args &&... args) {
  auto res = false;
  for (auto &func : module.getFuncs()) {
    if (func.second.isExternalFunc())
      continue;
    for (auto &bb : func.second.getMutableBBs()) {
      res |= Pass{bb, std::forward<Args>(args)...}();
    }
  }
  return res;
}